

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManComputeMapping(Nf_Man_t *p)

{
  word *pwVar1;
  undefined8 *puVar2;
  ulong uVar3;
  Nf_Obj_t *pNVar4;
  long lVar5;
  uint uVar6;
  Gia_Man_t *pGVar7;
  word wVar8;
  word wVar9;
  long lVar10;
  long lVar11;
  
  pGVar7 = p->pGia;
  if (0 < pGVar7->nObjs) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      if (pGVar7->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar3 = *(ulong *)(&pGVar7->pObjs->field_0x0 + lVar11);
      uVar6 = (uint)uVar3;
      if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
        if (((uVar6 & 0x1fffffff) == 0x1fffffff) ||
           ((uVar6 & 0x1fffffff) != ((uint)(uVar3 >> 0x20) & 0x1fffffff))) {
          Nf_ManCutMatch(p,(int)lVar10);
        }
        else {
          pNVar4 = p->pNfObjs;
          pwVar1 = &pNVar4->M[1][1].D + lVar11;
          *pwVar1 = 0;
          pwVar1[1] = 0;
          pwVar1 = &pNVar4->M[1][0].A + lVar11;
          *pwVar1 = 0;
          pwVar1[1] = 0;
          puVar2 = (undefined8 *)(&pNVar4->M[1][0].field_0x0 + lVar11 * 8);
          *puVar2 = 0;
          puVar2[1] = 0;
          pwVar1 = &pNVar4->M[0][1].D + lVar11;
          *pwVar1 = 0;
          pwVar1[1] = 0;
          pwVar1 = &pNVar4->M[0][0].A + lVar11;
          *pwVar1 = 0;
          pwVar1[1] = 0;
          puVar2 = (undefined8 *)(&pNVar4->M[0][0].field_0x0 + lVar11 * 8);
          *puVar2 = 0;
          puVar2[1] = 0;
          lVar5 = (ulong)((uint)(uVar3 >> 0x19) & 0x10) * 3;
          wVar8 = *(word *)((long)&pNVar4[-(ulong)(uVar6 & 0x1fffffff)].M[0][0].D +
                           lVar11 * 8 + lVar5);
          (&pNVar4->M[0][1].D)[lVar11] = wVar8;
          (&pNVar4->M[0][0].D)[lVar11] = wVar8;
          wVar9 = *(word *)((long)&pNVar4[-(ulong)(uVar6 & 0x1fffffff)].M[0][0].A +
                           lVar11 * 8 + lVar5);
          (&pNVar4->M[0][1].A)[lVar11] = wVar9;
          (&pNVar4->M[0][0].A)[lVar11] = wVar9;
          *(undefined4 *)(&pNVar4->M[0][0].field_0x0 + lVar11 * 8) = 0x80000000;
          wVar8 = wVar8 + p->InvDelay;
          (&pNVar4->M[1][1].D)[lVar11] = wVar8;
          (&pNVar4->M[1][0].D)[lVar11] = wVar8;
          wVar9 = wVar9 + p->InvArea;
          (&pNVar4->M[1][1].A)[lVar11] = wVar9;
          (&pNVar4->M[1][0].A)[lVar11] = wVar9;
          *(undefined4 *)(&pNVar4->M[1][1].field_0x0 + lVar11 * 8) = 0x40000000;
          *(undefined4 *)(&pNVar4->M[1][0].field_0x0 + lVar11 * 8) = 0xc0000000;
        }
      }
      lVar10 = lVar10 + 1;
      pGVar7 = p->pGia;
      lVar11 = lVar11 + 0xc;
    } while (lVar10 < pGVar7->nObjs);
  }
  return;
}

Assistant:

void Nf_ManComputeMapping( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Nf_ObjPrepareBuf( p, pObj );
        else
            Nf_ManCutMatch( p, i );
}